

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrload.c
# Opt level: O3

FT_Error pfr_extra_items_parse
                   (FT_Byte **pp,FT_Byte *limit,PFR_ExtraItem item_list,FT_Pointer item_data)

{
  byte *pbVar1;
  FT_UInt FVar2;
  PFR_ExtraItem_ParseFunc p_Var3;
  PFR_ExtraItem_ParseFunc *pp_Var4;
  FT_Error FVar5;
  uint uVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  
  pbVar9 = *pp;
  pbVar7 = pbVar9 + 1;
  FVar5 = 8;
  if (pbVar7 <= limit) {
    uVar6 = (uint)*pbVar9;
    if (*pbVar9 == 0) {
      FVar5 = 0;
      pbVar9 = pbVar7;
    }
    else {
      do {
        pbVar1 = pbVar7 + 2;
        pbVar9 = pbVar7;
        if ((limit < pbVar1) || (pbVar8 = pbVar1 + *pbVar7, pbVar9 = pbVar1, limit < pbVar8)) {
          FVar5 = 8;
          goto LAB_0022a8a1;
        }
        if ((item_list != (PFR_ExtraItem)0x0) &&
           (p_Var3 = item_list->parser, p_Var3 != (PFR_ExtraItem_ParseFunc)0x0)) {
          FVar2 = item_list->type;
          pp_Var4 = &item_list[1].parser;
          while (FVar2 != pbVar7[1]) {
            p_Var3 = *pp_Var4;
            if (p_Var3 == (PFR_ExtraItem_ParseFunc)0x0) goto LAB_0022a882;
            FVar2 = ((PFR_ExtraItemRec_ *)(pp_Var4 + -1))->type;
            pp_Var4 = pp_Var4 + 2;
          }
          FVar5 = (*p_Var3)(pbVar1,pbVar8,item_data);
          if (FVar5 != 0) goto LAB_0022a8a1;
        }
LAB_0022a882:
        uVar6 = uVar6 - 1;
        pbVar7 = pbVar8;
      } while (uVar6 != 0);
      FVar5 = 0;
      pbVar9 = pbVar8;
    }
  }
LAB_0022a8a1:
  *pp = pbVar9;
  return FVar5;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pfr_extra_items_parse( FT_Byte*       *pp,
                         FT_Byte*        limit,
                         PFR_ExtraItem   item_list,
                         FT_Pointer      item_data )
  {
    FT_Error  error = FT_Err_Ok;
    FT_Byte*  p     = *pp;
    FT_UInt   num_items, item_type, item_size;


    PFR_CHECK( 1 );
    num_items = PFR_NEXT_BYTE( p );

    for ( ; num_items > 0; num_items-- )
    {
      PFR_CHECK( 2 );
      item_size = PFR_NEXT_BYTE( p );
      item_type = PFR_NEXT_BYTE( p );

      PFR_CHECK( item_size );

      if ( item_list )
      {
        PFR_ExtraItem  extra = item_list;


        for ( extra = item_list; extra->parser != NULL; extra++ )
        {
          if ( extra->type == item_type )
          {
            error = extra->parser( p, p + item_size, item_data );
            if ( error )
              goto Exit;

            break;
          }
        }
      }

      p += item_size;
    }

  Exit:
    *pp = p;
    return error;

  Too_Short:
    FT_ERROR(( "pfr_extra_items_parse: invalid extra items table\n" ));
    error = FT_THROW( Invalid_Table );
    goto Exit;
  }